

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

cram_codec *
cram_byte_array_len_encode_init(cram_stats *st,cram_external_type option,void *dat,int version)

{
  cram_codec *pcVar1;
  cram_codec *pcVar2;
  
  pcVar1 = (cram_codec *)malloc(0x240);
  if (pcVar1 != (cram_codec *)0x0) {
    pcVar1->codec = E_BYTE_ARRAY_LEN;
    pcVar1->free = cram_byte_array_len_encode_free;
    pcVar1->encode = cram_byte_array_len_encode;
    pcVar1->store = cram_byte_array_len_encode_store;
    pcVar2 = cram_encoder_init(*dat,(cram_stats *)0x0,E_INT,*(void **)((long)dat + 8),version);
    (pcVar1->field_6).e_byte_array_len.len_codec = pcVar2;
    pcVar2 = cram_encoder_init(*(cram_encoding *)((long)dat + 4),(cram_stats *)0x0,E_BYTE_ARRAY,
                               *(void **)((long)dat + 0x10),version);
    (pcVar1->field_6).e_byte_array_len.val_codec = pcVar2;
  }
  return pcVar1;
}

Assistant:

cram_codec *cram_byte_array_len_encode_init(cram_stats *st,
					    enum cram_external_type option,
					    void *dat,
					    int version) {
    cram_codec *c;
    cram_byte_array_len_encoder *e = (cram_byte_array_len_encoder *)dat;

    c = malloc(sizeof(*c));
    if (!c)
	return NULL;
    c->codec = E_BYTE_ARRAY_LEN;
    c->free = cram_byte_array_len_encode_free;
    c->encode = cram_byte_array_len_encode;
    c->store = cram_byte_array_len_encode_store;

    c->e_byte_array_len.len_codec = cram_encoder_init(e->len_encoding,
						      NULL, E_INT, 
						      e->len_dat,
						      version);
    c->e_byte_array_len.val_codec = cram_encoder_init(e->val_encoding,
						      NULL, E_BYTE_ARRAY, 
						      e->val_dat,
						      version);

    return c;
}